

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O3

int flvtag_addsei(flvtag_t *tag,sei_t *sei)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  uint8_t *puVar4;
  byte bVar5;
  int iVar6;
  size_t sVar7;
  uint uVar8;
  flvtag_frametype_t type;
  uint *puVar9;
  long lVar10;
  flvtag_t new_tag;
  sei_t new_sei;
  flvtag_t tag3;
  flvtag_t local_78;
  sei_t local_68;
  flvtag_t *local_50;
  uint8_t *local_48;
  size_t sStack_40;
  
  pbVar3 = tag->data;
  iVar6 = 0;
  if ((((*pbVar3 & 0x1f) == 9) && ((pbVar3[0xb] & 0xf) == 7)) && (pbVar3[0xc] == 1)) {
    sei_init(&local_68,
             (double)(((uint)pbVar3[5] << 8 | (uint)pbVar3[7] << 0x18 | (uint)pbVar3[4] << 0x10 |
                      (uint)pbVar3[6]) +
                     ((uint)pbVar3[0xf] | (uint)pbVar3[0xd] << 0x10 | (uint)pbVar3[0xe] << 8)));
    type = flvtag_frametype_keyframe;
    sei_cat(&local_68,sei,1);
    pbVar3 = tag->data;
    uVar8 = 0;
    if ((*pbVar3 & 0x1f) == 9) {
      uVar8 = 0;
      if (((pbVar3[0xb] & 0xf) == 7) && (pbVar3[0xc] == 1)) {
        uVar8 = (uint)pbVar3[0xf] | (uint)pbVar3[0xe] << 8 | (uint)pbVar3[0xd] << 0x10;
      }
      type = (flvtag_frametype_t)(pbVar3[0xb] >> 4);
    }
    flvtag_initavc(&local_78,
                   (uint)pbVar3[6] |
                   (uint)pbVar3[5] << 8 | (uint)pbVar3[4] << 0x10 | (uint)pbVar3[7] << 0x18,uVar8,
                   type);
    puVar4 = tag->data;
    bVar5 = puVar4[1];
    bVar1 = puVar4[2];
    bVar2 = puVar4[3];
    local_50 = tag;
    sVar7 = flvtag_header_size(tag);
    lVar10 = ((ulong)bVar2 | (ulong)((uint)bVar1 << 8 | (uint)bVar5 << 0x10)) - sVar7;
    if (-0xb < lVar10) {
      lVar10 = lVar10 + 0xb;
      puVar9 = (uint *)(puVar4 + sVar7);
      do {
        bVar5 = (byte)puVar9[1] & 0x1f;
        uVar8 = *puVar9;
        uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        if (bVar5 == 6) {
          sei_cat(&local_68,sei,0);
        }
        else if (((byte)(bVar5 - 10) < 0xfd) && (local_68.head != (sei_message_t *)0x0)) {
          flvtag_avcwritesei(&local_78,&local_68);
          flvtag_avcwritenal(&local_78,(uint8_t *)(puVar9 + 1),(ulong)uVar8);
          sei_free(&local_68);
        }
        else {
          flvtag_avcwritenal(&local_78,(uint8_t *)(puVar9 + 1),(ulong)uVar8);
        }
        puVar9 = (uint *)((long)puVar9 + (ulong)(uVar8 + 4));
        lVar10 = lVar10 - (ulong)(uVar8 + 4);
      } while (0 < lVar10);
    }
    if (local_68.head != (sei_message_t *)0x0) {
      flvtag_avcwritesei(&local_78,&local_68);
      sei_free(&local_68);
    }
    local_48 = local_50->data;
    sStack_40 = local_50->aloc;
    local_50->data = local_78.data;
    local_50->aloc = local_78.aloc;
    if (local_48 != (uint8_t *)0x0) {
      local_78.data = local_48;
      local_78.aloc = sStack_40;
      free(local_48);
    }
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int flvtag_addsei(flvtag_t* tag, sei_t* sei)
{
    if (flvtag_avcpackettype_nalu != flvtag_avcpackettype(tag)) {
        return 0;
    }

    sei_t new_sei;
    sei_init(&new_sei, flvtag_pts(tag));
    sei_cat(&new_sei, sei, 1);

    flvtag_t new_tag;
    flvtag_initavc(&new_tag, flvtag_dts(tag), flvtag_cts(tag), flvtag_frametype(tag));

    uint8_t* data = flvtag_payload_data(tag);
    ssize_t size = flvtag_payload_size(tag);

    while (0 < size) {
        uint8_t* nalu_data = &data[LENGTH_SIZE];
        uint8_t nalu_type = nalu_data[0] & 0x1F;
        uint32_t nalu_size = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
        data += LENGTH_SIZE + nalu_size;
        size -= LENGTH_SIZE + nalu_size;

        if (6 == nalu_type) {
            sei_cat(&new_sei, sei, 0); // copy non itu_t_t35 sei messages
        } else if (new_sei.head && 7 != nalu_type && 8 != nalu_type && 9 != nalu_type) {
            flvtag_avcwritesei(&new_tag, &new_sei);
            flvtag_avcwritenal(&new_tag, nalu_data, nalu_size);
            sei_free(&new_sei);
        } else {
            flvtag_avcwritenal(&new_tag, nalu_data, nalu_size);
        }
    }

    // On the off chance we have an empty frame, we still wish to write the sei
    if (new_sei.head) {
        flvtag_avcwritesei(&new_tag, &new_sei);
        sei_free(&new_sei);
    }

    flvtag_swap(tag, &new_tag);
    flvtag_free(&new_tag);
    return 1;
}